

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

int get_distance_bw_nodes(GridNode *a,GridNode *b)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  
  uVar2 = (a->pos).x - (b->pos).x;
  uVar1 = -uVar2;
  if (0 < (int)uVar2) {
    uVar1 = uVar2;
  }
  uVar4 = (a->pos).y - (b->pos).y;
  uVar2 = -uVar4;
  if (0 < (int)uVar4) {
    uVar2 = uVar4;
  }
  uVar4 = uVar2;
  if (uVar1 < uVar2) {
    uVar4 = uVar1;
  }
  lVar5 = (ulong)uVar1 - (ulong)uVar2;
  lVar3 = -lVar5;
  if (0 < lVar5) {
    lVar3 = lVar5;
  }
  return (int)lVar3 * 10 + uVar4 * 0xe;
}

Assistant:

int get_distance_bw_nodes(GridNode *a, GridNode *b)
{
    int deltaX = absolute(a->pos.x - b->pos.x);
    int deltaY = absolute(a->pos.y - b->pos.y);
#if USE_ACCURATE_DIST
    int dist = (int)(sqrt((deltaX * deltaX) + (deltaY * deltaY)));
#else
    int dist = 14 * min(deltaX, deltaY) + 10 * (max(deltaX, deltaY) - min(deltaX, deltaY));
#endif
    return dist;
}